

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void uv__udp_io(uv_loop_t *loop,uv__io_t *w,uint revents)

{
  uint *handle;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  long lVar6;
  undefined1 *puVar7;
  ulong uVar8;
  ssize_t sVar9;
  ulong uVar10;
  ssize_t sVar11;
  long lVar12;
  msghdr h;
  sockaddr_storage peer;
  iovec iov [20];
  uv__mmsghdr msgs [20];
  sockaddr_in6 peers [20];
  uv_buf_t local_9a0;
  uint local_990;
  int local_98c;
  long local_988;
  long local_980;
  uv_buf_t local_978;
  msghdr local_968;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  uint auStack_8b0 [2];
  long local_8a8 [39];
  undefined4 local_770 [2];
  uv__mmsghdr local_768 [20];
  undefined1 local_268 [568];
  
  if (*(int *)&w[-2].cb != 0xf) {
    __assert_fail("handle->type == UV_UDP",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                  ,0xac,"void uv__udp_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  handle = &w[-3].pevents;
  if ((revents & 1) != 0) {
    if (*(long *)&w[-1].fd == 0) {
      __assert_fail("handle->recv_cb != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                    ,0xf6,"void uv__udp_recvmsg(uv_udp_t *)");
    }
    lVar6._0_4_ = w[-1].pevents;
    lVar6._4_4_ = w[-1].events;
    if (lVar6 == 0) {
      __assert_fail("handle->alloc_cb != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                    ,0xf7,"void uv__udp_recvmsg(uv_udp_t *)");
    }
    iVar3 = 0x20;
    local_990 = revents;
    while( true ) {
      local_9a0 = uv_buf_init((char *)0x0,0);
      (**(code **)&w[-1].pevents)(handle,0x10000,&local_9a0);
      if ((local_9a0.base == (char *)0x0) || (local_9a0.len == 0)) break;
      uv_once(&once,uv__udp_mmsg_init);
      if ((0x1ffff < local_9a0.len & uv__recvmmsg_avail) == 1) {
        uVar10 = local_9a0.len >> 0x10;
        if (0x13 < uVar10) {
          uVar10 = 0x14;
        }
        puVar7 = local_268;
        uVar8 = 0;
        pcVar4 = local_9a0.base;
        do {
          *(long *)((long)local_8a8 + uVar8) = (long)pcVar4;
          *(undefined8 *)((long)local_8a8 + uVar8 + 8) = 0x10000;
          *(long **)((long)&local_768[0].msg_hdr.msg_iov + uVar8 * 4) =
               (long *)((long)local_8a8 + uVar8);
          *(undefined8 *)((long)&local_768[0].msg_hdr.msg_iovlen + uVar8 * 4) = 1;
          *(undefined1 **)((long)&local_768[0].msg_hdr.msg_name + uVar8 * 4) = puVar7;
          (&local_768[0].msg_hdr.msg_namelen)[uVar8] = 0x1c;
          uVar8 = uVar8 + 0x10;
          puVar7 = puVar7 + 0x1c;
          pcVar4 = pcVar4 + 0x10000;
        } while ((uint)uVar10 << 4 != uVar8);
        local_98c = iVar3;
        do {
          uVar2 = uv__recvmmsg(w->fd,local_768,(uint)uVar10,0,(timespec *)0x0);
          if (uVar2 != 0xffffffff) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        if ((int)uVar2 < 1) {
          if (uVar2 == 0) {
LAB_0018a3c1:
            lVar6 = 0;
          }
          else {
            piVar5 = __errno_location();
            if ((long)*piVar5 == 0xb) goto LAB_0018a3c1;
            lVar6 = -(long)*piVar5;
          }
          (**(code **)&w[-1].fd)(handle,lVar6,&local_9a0);
        }
        else {
          lVar6 = (ulong)uVar2 * 0x10;
          local_988 = lVar6 + -8;
          lVar12 = 0;
          local_980 = lVar6;
          do {
            if (*(long *)&w[-1].fd == 0) break;
            local_978 = uv_buf_init(*(char **)((long)&local_8b8 + lVar12 + lVar6),
                                    *(uint *)((long)auStack_8b0 + lVar12 + lVar6));
            (**(code **)&w[-1].fd)(handle,local_770[(ulong)uVar2 * 0x10 + lVar12],&local_978);
            lVar12 = lVar12 + -0x10;
          } while (local_980 + lVar12 != 0);
        }
        sVar11 = (ssize_t)(int)uVar2;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        iVar3 = local_98c - uVar2;
        revents = local_990;
      }
      else {
        local_968.msg_control = (void *)0x0;
        local_968.msg_controllen = 0;
        local_968.msg_flags = 0;
        local_968._52_4_ = 0;
        local_928 = 0;
        uStack_920 = 0;
        local_918 = 0;
        uStack_910 = 0;
        local_908 = 0;
        uStack_900 = 0;
        local_8f8 = 0;
        uStack_8f0 = 0;
        local_8e8 = 0;
        uStack_8e0 = 0;
        local_8d8 = 0;
        uStack_8d0 = 0;
        local_8c8 = 0;
        uStack_8c0 = 0;
        local_8b8 = 0;
        auStack_8b0[0] = 0;
        auStack_8b0[1] = 0;
        local_968.msg_name = &local_928;
        local_968.msg_namelen = 0x80;
        local_968._12_4_ = 0;
        local_968.msg_iovlen = 1;
        local_968.msg_iov = (iovec *)&local_9a0;
        do {
          sVar11 = recvmsg(w->fd,&local_968,0);
          sVar9 = sVar11;
          if (sVar11 != -1) goto LAB_0018a3f9;
          piVar5 = __errno_location();
          iVar1 = *piVar5;
        } while ((long)iVar1 == 4);
        if (iVar1 == 0xb) {
          sVar9 = 0;
        }
        else {
          sVar9 = -(long)iVar1;
        }
LAB_0018a3f9:
        (**(code **)&w[-1].fd)(handle,sVar9,&local_9a0);
        iVar3 = iVar3 + -1;
      }
      if ((((sVar11 == -1) || (iVar3 < 1)) || (w->fd == -1)) || (*(long *)&w[-1].fd == 0))
      goto LAB_0018a47a;
    }
    (**(code **)&w[-1].fd)(handle,0xffffffffffffff97,&local_9a0,0,0);
  }
LAB_0018a47a:
  if ((revents & 4) != 0) {
    uv__udp_sendmsg((uv_udp_t *)handle);
    uv__udp_run_completed((uv_udp_t *)handle);
  }
  return;
}

Assistant:

static void uv__udp_io(uv_loop_t* loop, uv__io_t* w, unsigned int revents) {
  uv_udp_t* handle;

  handle = container_of(w, uv_udp_t, io_watcher);
  assert(handle->type == UV_UDP);

  if (revents & POLLIN)
    uv__udp_recvmsg(handle);

  if (revents & POLLOUT) {
    uv__udp_sendmsg(handle);
    uv__udp_run_completed(handle);
  }
}